

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderPrefix(xmlTextReaderPtr reader)

{
  xmlChar *pxVar1;
  xmlNsPtr ns;
  xmlNodePtr pxVar2;
  
  if ((reader != (xmlTextReaderPtr)0x0) && (reader->node != (xmlNodePtr)0x0)) {
    pxVar2 = reader->node;
    if (reader->curnode != (xmlNodePtr)0x0) {
      pxVar2 = reader->curnode;
    }
    if (pxVar2->type - XML_ELEMENT_NODE < 2) {
      if ((pxVar2->ns != (xmlNs *)0x0) && (pxVar1 = pxVar2->ns->prefix, pxVar1 != (xmlChar *)0x0)) {
        pxVar1 = xmlStrdup(pxVar1);
        return pxVar1;
      }
    }
    else if ((pxVar2->type == XML_NAMESPACE_DECL) && (pxVar2->children != (_xmlNode *)0x0)) {
      pxVar1 = xmlStrdup("xmlns");
      return pxVar1;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderPrefix(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    if (node->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) node;
	if (ns->prefix == NULL)
	    return(NULL);
	return(xmlStrdup(BAD_CAST "xmlns"));
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE))
	return(NULL);
    if ((node->ns != NULL) && (node->ns->prefix != NULL))
	return(xmlStrdup(node->ns->prefix));
    return(NULL);
}